

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

LY_ERR lyjson_next_object_name(lyjson_ctx *jsonctx)

{
  char cVar1;
  ly_ctx *plVar2;
  LY_ERR LVar3;
  uint uVar4;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  lyjson_ctx *jsonctx_local;
  
  cVar1 = *jsonctx->in->current;
  if (cVar1 == '\0') {
    ly_vlog(jsonctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
    return LY_EVALID;
  }
  if (cVar1 == '\"') {
    ly_in_skip(jsonctx->in,1);
    LVar3 = lyjson_string(jsonctx);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    lyjson_skip_ws(jsonctx);
    if (*jsonctx->in->current != ':') {
      plVar2 = jsonctx->ctx;
      uVar4 = LY_VCODE_INSTREXP_len(jsonctx->in->current);
      ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
              (ulong)uVar4,jsonctx->in->current,"a JSON value name-separator \':\'");
      return LY_EVALID;
    }
    ly_in_skip(jsonctx->in,1);
    jsonctx_local._4_4_ = ly_set_add(&jsonctx->status,(void *)0x7,'\x01',(uint32_t *)0x0);
  }
  else {
    if (cVar1 != '}') {
      plVar2 = jsonctx->ctx;
      uVar4 = LY_VCODE_INSTREXP_len(jsonctx->in->current);
      ly_vlog(plVar2,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
              (ulong)uVar4,jsonctx->in->current,"a JSON object name");
      return LY_EVALID;
    }
    ly_in_skip(jsonctx->in,1);
    jsonctx_local._4_4_ = ly_set_add(&jsonctx->status,(void *)0x3,'\x01',(uint32_t *)0x0);
  }
  if (jsonctx_local._4_4_ == LY_SUCCESS) {
    jsonctx_local._4_4_ = LY_SUCCESS;
  }
  return jsonctx_local._4_4_;
}

Assistant:

static LY_ERR
lyjson_next_object_name(struct lyjson_ctx *jsonctx)
{
    switch (*jsonctx->in->current) {
    case '\0':
        /* EOF */
        LOGVAL(jsonctx->ctx, LY_VCODE_EOF);
        return LY_EVALID;

    case '"':
        /* object name */
        ly_in_skip(jsonctx->in, 1);
        LY_CHECK_RET(lyjson_string(jsonctx));
        lyjson_skip_ws(jsonctx);

        if (*jsonctx->in->current != ':') {
            LOGVAL(jsonctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(jsonctx->in->current), jsonctx->in->current,
                    "a JSON value name-separator ':'");
            return LY_EVALID;
        }
        ly_in_skip(jsonctx->in, 1);
        LYJSON_STATUS_PUSH_RET(jsonctx, LYJSON_OBJECT_NAME);
        break;

    case '}':
        /* object end */
        ly_in_skip(jsonctx->in, 1);
        LYJSON_STATUS_PUSH_RET(jsonctx, LYJSON_OBJECT_CLOSED);
        break;

    default:
        /* unexpected value */
        LOGVAL(jsonctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(jsonctx->in->current),
                jsonctx->in->current, "a JSON object name");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}